

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Logging.cc
# Opt level: O1

void __thiscall tt::Logger::Logger(Logger *this,char *fileName,int line)

{
  allocator local_21;
  
  memset(this,0,0xfb0);
  (this->m_impl).m_stream.m_buffer.m_cur = (this->m_impl).m_stream.m_buffer.m_data;
  (this->m_impl).m_line = line;
  std::__cxx11::string::string((string *)&(this->m_impl).m_basename,fileName,&local_21);
  Impl::formatTime(&this->m_impl);
  return;
}

Assistant:

Logger::Logger(const char* fileName, int line)
	:m_impl(fileName,line){
	
	}